

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateTemplateNode::Expand
          (TemplateTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  HashedTemplateString *pHVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  TemplateDictionaryInterface *dictionary_00;
  char *pcVar6;
  undefined4 extraout_var_01;
  bool bVar7;
  int dict_num;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pHVar1 = &this->variable_;
  iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[5])(dictionary,pHVar1);
  bVar7 = true;
  if ((char)iVar4 == '\0') {
    iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[7])(dictionary,pHVar1);
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
    if (cVar2 == '\0') {
      (**(code **)(*plVar5 + 8))(plVar5);
      iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[6])(dictionary,pHVar1,0);
      pcVar6 = (char *)CONCAT44(extraout_var_01,iVar4);
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        bVar7 = ExpandOnce(this,output_buffer,dictionary,pcVar6,per_expand_data,cache);
        return bVar7;
      }
    }
    else {
      uVar8 = 0;
      bVar7 = true;
      while( true ) {
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (cVar2 == '\0') break;
        dictionary_00 = (TemplateDictionaryInterface *)(**(code **)(*plVar5 + 0x18))(plVar5);
        iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[6])(dictionary,pHVar1,uVar8);
        pcVar6 = (char *)CONCAT44(extraout_var_00,iVar4);
        if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
          bVar3 = ExpandOnce(this,output_buffer,dictionary_00,pcVar6,per_expand_data,cache);
          bVar7 = (bool)(bVar7 & bVar3);
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  return bVar7;
}

Assistant:

bool TemplateTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData *per_expand_data,
                                  const TemplateCache *cache) const {
  if (dictionary->IsHiddenTemplate(variable_)) {
    // if this "template include" section is "hidden", do nothing
    return true;
  }

  TemplateDictionaryInterface::Iterator* di =
      dictionary->CreateTemplateIterator(variable_);

  if (!di->HasNext()) {  // empty dict means 'expand once using containing dict'
    delete di;
    // TODO(csilvers): have this return a TemplateString instead?
    const char* const filename =
        dictionary->GetIncludeTemplateName(variable_, 0);
    // If the filename wasn't set then treat it as if it were "hidden", i.e, do
    // nothing
    if (filename && *filename) {
      return ExpandOnce(output_buffer, *dictionary, filename, per_expand_data,
                        cache);
    } else {
      return true;
    }
  }

  bool error_free = true;
  for (int dict_num = 0; di->HasNext(); ++dict_num) {
    const TemplateDictionaryInterface& child = di->Next();
    // We do this in the loop, because maybe one day we'll support
    // each expansion having its own template dictionary.  That's also
    // why we pass in the dictionary-index as an argument.
    const char* const filename = dictionary->GetIncludeTemplateName(
        variable_, dict_num);
    // If the filename wasn't set then treat it as if it were "hidden", i.e, do
    // nothing
    if (filename && *filename) {
      error_free &= ExpandOnce(output_buffer, child, filename, per_expand_data,
                               cache);
    }
  }
  delete di;

  return error_free;
}